

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O0

void idwt_sym_stride(double *cA,int len_cA,double *cD,double *lpr,double *hpr,int lpr_len,double *X,
                    int istride,int ostride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int is;
  int ns;
  int ms;
  int v;
  int t;
  int n;
  int m;
  int l;
  int i;
  int len_avg;
  int lpr_len_local;
  double *hpr_local;
  double *lpr_local;
  double *cD_local;
  int len_cA_local;
  double *cA_local;
  
  t = -2;
  v = -1;
  for (ns = 0; ns < len_cA; ns = ns + 1) {
    t = t + 2;
    v = v + 2;
    iVar1 = t * ostride;
    iVar2 = v * ostride;
    X[iVar1] = 0.0;
    X[iVar2] = 0.0;
    for (n = 0; n < lpr_len / 2; n = n + 1) {
      iVar3 = n * 2;
      if ((-1 < ns - n) && (ns - n < len_cA)) {
        iVar4 = (ns - n) * istride;
        X[iVar1] = lpr[iVar3] * cA[iVar4] + hpr[iVar3] * cD[iVar4] + X[iVar1];
        X[iVar2] = lpr[iVar3 + 1] * cA[iVar4] + hpr[iVar3 + 1] * cD[iVar4] + X[iVar2];
      }
    }
  }
  return;
}

Assistant:

void idwt_sym_stride(double *cA, int len_cA, double *cD, double *lpr, double *hpr, int lpr_len, double *X, int istride, int ostride) {
	int len_avg, i, l, m, n, t, v;
	int ms, ns, is;
	len_avg = lpr_len;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		ms = m * ostride;
		ns = n * ostride;
		X[ms] = 0.0;
		X[ns] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				is = (i - l) * istride;
				X[ms] += lpr[t] * cA[is] + hpr[t] * cD[is];
				X[ns] += lpr[t + 1] * cA[is] + hpr[t + 1] * cD[is];
			}
		}
	}
}